

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nextval.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::Deserialize(Deserializer *deserializer,ScalarFunction *param_2)

{
  int iVar1;
  pointer pCVar2;
  ClientContext *context;
  SequenceCatalogEntry *pSVar3;
  _func_int **pp_Var4;
  pointer *__ptr;
  type ret;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_28;
  CreateInfo *local_20;
  
  iVar1 = (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function
            [4])(param_2,100,"sequence_create_info");
  if ((char)iVar1 == '\0') {
    (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[5])
              (param_2,0);
  }
  else {
    local_28._M_head_impl = (CreateInfo *)0x0;
    iVar1 = (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function
              [10])(param_2);
    if ((char)iVar1 == '\0') {
      local_20 = (CreateInfo *)0x0;
    }
    else {
      (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[6])
                (param_2);
      CreateInfo::Deserialize((CreateInfo *)&stack0xffffffffffffffe0,(Deserializer *)param_2);
      local_28._M_head_impl = local_20;
      (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[7])
                (param_2);
    }
    (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[0xb])
              (param_2);
    (*(param_2->super_BaseScalarFunction).super_SimpleFunction.super_Function._vptr_Function[5])
              (param_2,1);
    if (local_20 != (CreateInfo *)0x0) {
      pCVar2 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
               operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                           *)&local_28);
      context = Deserializer::Get<duckdb::ClientContext&>((Deserializer *)param_2);
      pSVar3 = BindSequenceFromContext
                         (context,&pCVar2->catalog,&pCVar2->schema,(string *)(pCVar2 + 1));
      pp_Var4 = (_func_int **)operator_new(0x18);
      *pp_Var4 = (_func_int *)&PTR__NextvalBindData_01987bf0;
      pp_Var4[1] = (_func_int *)pSVar3;
      (*(pSVar3->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry._vptr_CatalogEntry[8])
                (pp_Var4 + 2,pSVar3);
      deserializer->_vptr_Deserializer = pp_Var4;
      if (local_28._M_head_impl == (CreateInfo *)0x0) {
        return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
               (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
               deserializer;
      }
      (*((local_28._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             deserializer;
    }
  }
  deserializer->_vptr_Deserializer = (_func_int **)0x0;
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)deserializer;
}

Assistant:

unique_ptr<FunctionData> Deserialize(Deserializer &deserializer, ScalarFunction &) {
	auto create_info = deserializer.ReadPropertyWithExplicitDefault<unique_ptr<CreateInfo>>(100, "sequence_create_info",
	                                                                                        unique_ptr<CreateInfo>());
	if (!create_info) {
		return nullptr;
	}
	auto &seq_info = create_info->Cast<CreateSequenceInfo>();
	auto &context = deserializer.Get<ClientContext &>();
	auto &sequence = BindSequenceFromContext(context, seq_info.catalog, seq_info.schema, seq_info.name);
	return make_uniq<NextvalBindData>(sequence);
}